

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strscan.c
# Opt level: O1

StrScanFmt
strscan_dec(uint8_t *p,TValue *o,StrScanFmt fmt,uint32_t opt,int32_t ex10,int32_t neg,uint32_t dig)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  uint32_t uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  byte bVar8;
  uint uVar9;
  uint32_t uVar10;
  StrScanFmt SVar11;
  uint64_t uVar12;
  int ex2;
  uint uVar13;
  int iVar14;
  long lVar15;
  byte *pbVar16;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  byte bVar20;
  uint uVar21;
  int iVar22;
  StrScanFmt SVar23;
  ulong uVar24;
  double dVar25;
  uint8_t xi [512];
  undefined8 local_240;
  byte local_238 [520];
  
  local_240 = o;
  if (dig == 0) {
    local_238[0] = 0;
    uVar13 = 0;
    dig = 0;
    uVar24 = 0;
  }
  else {
    uVar24 = 0;
    iVar14 = dig - 800;
    if (dig < 800) {
      iVar14 = 0;
    }
    uVar3 = 800;
    if (dig < 800) {
      uVar3 = dig;
    }
    uVar13 = iVar14 + ex10;
    if (((uVar13 ^ uVar3) & 1) != 0) {
      bVar8 = *p;
      if (bVar8 == 0x2e) {
        bVar8 = p[1];
        p = p + 1;
      }
      local_238[0] = bVar8 & 0xf;
      uVar3 = uVar3 - 1;
      p = p + 1;
      uVar24 = 1;
    }
    if (1 < uVar3) {
      uVar9 = uVar3 - 2;
      iVar14 = (int)uVar24;
      do {
        bVar8 = *p;
        if (bVar8 == 0x2e) {
          bVar8 = p[1];
          p = p + 1;
        }
        bVar20 = p[1];
        lVar15 = 1;
        if (bVar20 == 0x2e) {
          bVar20 = p[2];
          lVar15 = 2;
        }
        local_238[uVar24] = (bVar20 & 0xf) + (bVar8 & 0xf) * '\n';
        uVar24 = uVar24 + 1;
        p = p + lVar15 + 1;
        uVar3 = uVar3 - 2;
      } while ((uVar9 >> 1) + iVar14 + 1 != uVar24);
    }
    if (uVar3 != 0) {
      bVar8 = *p;
      if (bVar8 == 0x2e) {
        bVar8 = p[1];
        p = p + 1;
      }
      local_238[uVar24] = (bVar8 & 0xf) * '\n';
      uVar24 = uVar24 + 1;
      uVar13 = uVar13 - 1;
      dig = dig + 1;
      p = p + 1;
    }
    if (dig < 0x321) {
      if (dig < 0x13 && 0 < (int)uVar13) {
        iVar14 = 0x11 - dig;
        if (0x11 < dig) {
          iVar14 = 0;
        }
        uVar9 = iVar14 + 1U >> 1;
        uVar3 = 2;
        if ((int)uVar13 < 2) {
          uVar3 = uVar13;
        }
        uVar3 = (uVar13 - uVar3) + 1 >> 1;
        if (uVar9 < uVar3) {
          uVar3 = uVar9;
        }
        memset(local_238 + uVar24,0,(ulong)(uVar3 + 1));
        uVar24 = uVar24 + uVar3 + 1;
        uVar13 = (uVar13 + uVar3 * -2) - 2;
        dig = dig + uVar3 * 2 + 2;
      }
    }
    else {
      do {
        bVar8 = *p;
        if (bVar8 == 0x2e) {
          bVar8 = p[1];
          p = p + 1;
        }
        if (bVar8 != 0x30) {
          local_238[uVar24 - 1] = local_238[uVar24 - 1] | 1;
          break;
        }
        p = p + 1;
        dig = dig - 1;
      } while (800 < dig);
      dig = 800;
    }
  }
  if ((dig < 0x15) && (uVar13 == 0)) {
    uVar5 = (ulong)local_238[0];
    if (1 < (long)uVar24) {
      pbVar16 = local_238 + 1;
      do {
        uVar5 = (ulong)*pbVar16 + uVar5 * 100;
        pbVar16 = pbVar16 + 1;
      } while (pbVar16 < local_238 + uVar24);
    }
    SVar23 = fmt;
    if ((dig != 0x14) || ((bVar2 = true, local_238[0] < 0x13 && ((long)uVar5 < 0)))) {
      if (fmt - STRSCAN_I64 < 2) {
        uVar6 = -uVar5;
        if (neg == 0) {
          uVar6 = uVar5;
        }
        local_240->u64 = uVar6;
        bVar2 = false;
      }
      else {
        uVar4 = (uint32_t)uVar5;
        if (fmt == STRSCAN_U32) {
LAB_0011bc1a:
          bVar2 = false;
          if (uVar5 >> 0x20 == 0) {
            uVar10 = -uVar4;
            if (neg == 0) {
              uVar10 = uVar4;
            }
            (local_240->u32).lo = uVar10;
            SVar23 = STRSCAN_U32;
            bVar2 = false;
          }
          else {
            SVar23 = STRSCAN_ERROR;
          }
        }
        else {
          SVar11 = fmt;
          if (fmt == STRSCAN_INT) {
            if (((opt & 2) == 0) && (uVar5 < (neg | 0x80000000))) {
              uVar10 = -uVar4;
              if (neg == 0) {
                uVar10 = uVar4;
              }
              (local_240->u32).lo = uVar10;
              SVar23 = STRSCAN_INT;
              fmt = STRSCAN_INT;
              bVar2 = false;
              goto LAB_0011bc4f;
            }
            SVar11 = STRSCAN_NUM;
            if ((opt & 0x10) != 0) goto LAB_0011bc1a;
          }
          fmt = SVar11;
          if ((long)uVar5 < 0) {
            bVar2 = true;
          }
          else {
            dVar25 = (double)(long)uVar5;
            if (neg != 0) {
              dVar25 = -dVar25;
            }
            local_240->n = dVar25;
            SVar23 = SVar11;
            bVar2 = false;
          }
        }
      }
    }
LAB_0011bc4f:
    if (!bVar2) {
      return SVar23;
    }
  }
  if (fmt == STRSCAN_INT) {
    fmt = STRSCAN_NUM;
    if ((opt & 0x10) == 0) {
LAB_0011bc7c:
      iVar14 = ((int)uVar13 >> 1) + (int)uVar24;
      if (0x9b < iVar14) {
        uVar12 = 0xfff0000000000000;
        if (neg == 0) {
          uVar12 = 0x7ff0000000000000;
        }
        local_240->u64 = uVar12;
        return fmt;
      }
      if (iVar14 < -0xa3) {
        uVar12 = 0;
        if (neg != 0) {
          uVar12 = 0x8000000000000000;
        }
        local_240->u64 = uVar12;
        return fmt;
      }
      uVar5 = 0;
      ex2 = 0;
      if (iVar14 < 9) {
        uVar5 = 0;
        do {
          uVar13 = (uint)uVar5;
          if ((int)((int)uVar24 - uVar13 & 0x1ff) <= iVar14) break;
          uVar9 = (int)uVar24 + 0x1ff;
          uVar3 = 0;
          do {
            uVar6 = uVar24;
            uVar18 = uVar9 & 0x1ff;
            uVar21 = (uint)local_238[uVar18] * 0x40 + uVar3;
            uVar3 = uVar21 / 100;
            local_238[uVar18] = (byte)(uVar21 % 100);
            uVar1 = (uint)uVar6;
            uVar24 = uVar6 & 0xffffffff;
            if ((uVar1 - 1 & 0x1ff) == uVar18 && uVar21 % 100 == 0) {
              uVar24 = (ulong)uVar18;
            }
            uVar9 = uVar18 - 1;
          } while (uVar18 != uVar13);
          uVar24 = uVar6 & 0xffffffff;
          if (99 < uVar21) {
            uVar13 = uVar13 - 1 & 0x1ff;
            uVar5 = (ulong)uVar13;
            uVar17 = (ulong)(uVar1 - 1 & 0x1ff);
            uVar24 = uVar17;
            if ((local_238[uVar17] != 0) && (uVar24 = uVar6 & 0xffffffff, uVar13 == uVar1)) {
              local_238[uVar1 + 0x1fe & 0x1ff] =
                   local_238[uVar1 + 0x1fe & 0x1ff] | local_238[uVar17];
              uVar24 = uVar17;
            }
            local_238[uVar5] = (byte)uVar3;
            iVar14 = iVar14 + 1;
          }
          ex2 = ex2 + -6;
        } while (iVar14 < 9);
      }
      uVar3 = (uint)uVar24;
      uVar13 = (uint)uVar5;
      while (9 < iVar14) {
        uVar17 = 0;
        uVar6 = uVar5;
        do {
          iVar19 = (int)uVar5;
          uVar3 = (uint)local_238[uVar5] + (int)uVar17;
          local_238[uVar5] = (byte)(uVar3 >> 6);
          uVar17 = (ulong)((uVar3 & 0x3f) * 100);
          iVar22 = (int)uVar6;
          bVar2 = (uVar3 & 0x3fc0) == 0;
          uVar7 = (ulong)(iVar22 + 1U & 0x1ff);
          if (iVar19 != iVar22 || !bVar2) {
            uVar7 = uVar6;
          }
          uVar13 = (uint)uVar7;
          iVar14 = iVar14 - (uint)(iVar19 == iVar22 && bVar2);
          uVar9 = iVar19 + 1U & 0x1ff;
          uVar5 = (ulong)uVar9;
          uVar6 = uVar7;
        } while (uVar9 != (uint)uVar24);
        if ((uVar3 & 0x3f) != 0) {
          do {
            uVar3 = (uint)uVar24;
            if (uVar13 == uVar3) {
              local_238[uVar3 - 1 & 0x1ff] = local_238[uVar3 - 1 & 0x1ff] | 1;
              break;
            }
            local_238[uVar24 & 0xffffffff] = (byte)(uVar17 >> 6);
            uVar24 = (ulong)(uVar3 + 1 & 0x1ff);
            uVar5 = uVar17 & 0x3c;
            uVar17 = (ulong)(((uint)uVar17 & 0x3c) * 100);
          } while (uVar5 != 0);
        }
        uVar3 = (uint)uVar24;
        ex2 = ex2 + 6;
        uVar5 = uVar7;
      }
      uVar24 = (ulong)local_238[uVar13];
      while( true ) {
        uVar13 = uVar13 + 1 & 0x1ff;
        if ((iVar14 < 2) || (uVar13 == uVar3)) break;
        uVar24 = (ulong)local_238[uVar13] + uVar24 * 100;
        iVar14 = iVar14 + -1;
      }
      if (uVar13 == uVar3) {
        if (0 < iVar14 + -1) {
          do {
            uVar24 = uVar24 * 100;
            iVar14 = iVar14 + -1;
          } while (1 < iVar14);
        }
      }
      else {
        uVar24 = uVar24 * 2;
        ex2 = ex2 + -1;
        do {
          if (local_238[uVar13] != 0) {
            uVar24 = uVar24 | 1;
            break;
          }
          uVar13 = uVar13 + 1 & 0x1ff;
        } while (uVar13 != uVar3);
      }
      strscan_double(uVar24,local_240,ex2,neg);
      return fmt;
    }
  }
  else if (fmt < STRSCAN_U32) goto LAB_0011bc7c;
  return STRSCAN_ERROR;
}

Assistant:

static StrScanFmt strscan_dec(const uint8_t *p, TValue *o,
			      StrScanFmt fmt, uint32_t opt,
			      int32_t ex10, int32_t neg, uint32_t dig)
{
  uint8_t xi[STRSCAN_DDIG], *xip = xi;

  if (dig) {
    uint32_t i = dig;
    if (i > STRSCAN_MAXDIG) {
      ex10 += (int32_t)(i - STRSCAN_MAXDIG);
      i = STRSCAN_MAXDIG;
    }
    /* Scan unaligned leading digit. */
    if (((ex10^i) & 1))
      *xip++ = ((*p != '.' ? *p : *++p) & 15), i--, p++;
    /* Scan aligned double-digits. */
    for ( ; i > 1; i -= 2) {
      uint32_t d = 10 * ((*p != '.' ? *p : *++p) & 15); p++;
      *xip++ = d + ((*p != '.' ? *p : *++p) & 15); p++;
    }
    /* Scan and realign trailing digit. */
    if (i) *xip++ = 10 * ((*p != '.' ? *p : *++p) & 15), ex10--, dig++, p++;

    /* Summarize rounding-effect of excess digits. */
    if (dig > STRSCAN_MAXDIG) {
      do {
	if ((*p != '.' ? *p : *++p) != '0') { xip[-1] |= 1; break; }
	p++;
      } while (--dig > STRSCAN_MAXDIG);
      dig = STRSCAN_MAXDIG;
    } else {  /* Simplify exponent. */
      while (ex10 > 0 && dig <= 18) *xip++ = 0, ex10 -= 2, dig += 2;
    }
  } else {  /* Only got zeros. */
    ex10 = 0;
    xi[0] = 0;
  }

  /* Fast path for numbers in integer format (but handles e.g. 1e6, too). */
  if (dig <= 20 && ex10 == 0) {
    uint8_t *xis;
    uint64_t x = xi[0];
    double n;
    for (xis = xi+1; xis < xip; xis++) x = x * 100 + *xis;
    if (!(dig == 20 && (xi[0] > 18 || (int64_t)x >= 0))) {  /* No overflow? */
      /* Format-specific handling. */
      switch (fmt) {
      case STRSCAN_INT:
	if (!(opt & STRSCAN_OPT_TONUM) && x < 0x80000000u+neg) {
	  o->i = neg ? (int32_t)(~x+1u) : (int32_t)x;
	  return STRSCAN_INT;  /* Fast path for 32 bit integers. */
	}
	if (!(opt & STRSCAN_OPT_C)) { fmt = STRSCAN_NUM; goto plainnumber; }
	/* fallthrough */
      case STRSCAN_U32:
	if ((x >> 32) != 0) return STRSCAN_ERROR;
	o->i = neg ? (int32_t)(~x+1u) : (int32_t)x;
	return STRSCAN_U32;
      case STRSCAN_I64:
      case STRSCAN_U64:
	o->u64 = neg ? ~x+1u : x;
	return fmt;
      default:
      plainnumber:  /* Fast path for plain numbers < 2^63. */
	if ((int64_t)x < 0) break;
	n = (double)(int64_t)x;
	if (neg) n = -n;
	o->n = n;
	return fmt;
      }
    }
  }

  /* Slow non-integer path. */
  if (fmt == STRSCAN_INT) {
    if ((opt & STRSCAN_OPT_C)) return STRSCAN_ERROR;
    fmt = STRSCAN_NUM;
  } else if (fmt > STRSCAN_INT) {
    return STRSCAN_ERROR;
  }
  {
    uint32_t hi = 0, lo = (uint32_t)(xip-xi);
    int32_t ex2 = 0, idig = (int32_t)lo + (ex10 >> 1);

    lj_assertX(lo > 0 && (ex10 & 1) == 0, "bad lo %d ex10 %d", lo, ex10);

    /* Handle simple overflow/underflow. */
    if (idig > 310/2) { if (neg) setminfV(o); else setpinfV(o); return fmt; }
    else if (idig < -326/2) { o->n = neg ? -0.0 : 0.0; return fmt; }

    /* Scale up until we have at least 17 or 18 integer part digits. */
    while (idig < 9 && idig < DLEN(lo, hi)) {
      uint32_t i, cy = 0;
      ex2 -= 6;
      for (i = DPREV(lo); ; i = DPREV(i)) {
	uint32_t d = (xi[i] << 6) + cy;
	cy = (((d >> 2) * 5243) >> 17); d = d - cy * 100;  /* Div/mod 100. */
	xi[i] = (uint8_t)d;
	if (i == hi) break;
	if (d == 0 && i == DPREV(lo)) lo = i;
      }
      if (cy) {
	hi = DPREV(hi);
	if (xi[DPREV(lo)] == 0) lo = DPREV(lo);
	else if (hi == lo) { lo = DPREV(lo); xi[DPREV(lo)] |= xi[lo]; }
	xi[hi] = (uint8_t)cy; idig++;
      }
    }

    /* Scale down until no more than 17 or 18 integer part digits remain. */
    while (idig > 9) {
      uint32_t i = hi, cy = 0;
      ex2 += 6;
      do {
	cy += xi[i];
	xi[i] = (cy >> 6);
	cy = 100 * (cy & 0x3f);
	if (xi[i] == 0 && i == hi) hi = DNEXT(hi), idig--;
	i = DNEXT(i);
      } while (i != lo);
      while (cy) {
	if (hi == lo) { xi[DPREV(lo)] |= 1; break; }
	xi[lo] = (cy >> 6); lo = DNEXT(lo);
	cy = 100 * (cy & 0x3f);
      }
    }

    /* Collect integer part digits and convert to rescaled double. */
    {
      uint64_t x = xi[hi];
      uint32_t i;
      for (i = DNEXT(hi); --idig > 0 && i != lo; i = DNEXT(i))
	x = x * 100 + xi[i];
      if (i == lo) {
	while (--idig >= 0) x = x * 100;
      } else {  /* Gather round bit from remaining digits. */
	x <<= 1; ex2--;
	do {
	  if (xi[i]) { x |= 1; break; }
	  i = DNEXT(i);
	} while (i != lo);
      }
      strscan_double(x, o, ex2, neg);
    }
  }
  return fmt;
}